

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O2

int irafncmp(char *irafheader,char *teststring,int nc)

{
  int iVar1;
  char *__s1;
  uint uVar2;
  
  __s1 = iraf2str(irafheader,5);
  if (__s1 == (char *)0x0) {
    uVar2 = 1;
  }
  else {
    iVar1 = strncmp(__s1,teststring,5);
    uVar2 = (uint)(iVar1 != 0);
    free(__s1);
  }
  return uVar2;
}

Assistant:

static int irafncmp (

char	*irafheader,	/* IRAF image header from file */
char	*teststring,	/* C character string to compare */
int	nc)		/* Number of characters to compate */

{
    char *line;

    if ((line = iraf2str (irafheader, nc)) == NULL)
	return (1);
    if (strncmp (line, teststring, nc) == 0) {
	free (line);
	return (0);
	}
    else {
	free (line);
	return (1);
	}
}